

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FenceBase.hpp
# Opt level: O0

void __thiscall
Diligent::FenceBase<Diligent::EngineGLImplTraits>::DvpDeviceWait
          (FenceBase<Diligent::EngineGLImplTraits> *this,Uint64 Value)

{
  RenderDeviceGLImpl *this_00;
  DeviceFeatures *pDVar1;
  atomic<unsigned_long> *paVar2;
  Char *Message;
  undefined1 local_58 [8];
  string msg;
  __int_type EnqueuedValue;
  Uint64 Value_local;
  FenceBase<Diligent::EngineGLImplTraits> *this_local;
  memory_order local_18;
  int local_14;
  memory_order __b;
  
  EnqueuedValue = Value;
  Value_local = (Uint64)this;
  this_00 = DeviceObjectBase<Diligent::IFenceGL,_Diligent::RenderDeviceGLImpl,_Diligent::FenceDesc>
            ::GetDevice(&this->
                         super_DeviceObjectBase<Diligent::IFenceGL,_Diligent::RenderDeviceGLImpl,_Diligent::FenceDesc>
                       );
  pDVar1 = RenderDeviceBase<Diligent::EngineGLImplTraits>::GetFeatures
                     (&this_00->super_RenderDeviceBase<Diligent::EngineGLImplTraits>);
  if (pDVar1->NativeFence == DEVICE_FEATURE_STATE_DISABLED) {
    paVar2 = &this->m_EnqueuedFenceValue;
    local_14 = 5;
    ___b = paVar2;
    local_18 = std::operator&(memory_order_seq_cst,__memory_order_mask);
    if (local_14 - 1U < 2) {
      this_local = (FenceBase<Diligent::EngineGLImplTraits> *)
                   (paVar2->super___atomic_base<unsigned_long>)._M_i;
    }
    else if (local_14 == 5) {
      this_local = (FenceBase<Diligent::EngineGLImplTraits> *)
                   (paVar2->super___atomic_base<unsigned_long>)._M_i;
    }
    else {
      this_local = (FenceBase<Diligent::EngineGLImplTraits> *)
                   (paVar2->super___atomic_base<unsigned_long>)._M_i;
    }
    msg.field_2._8_8_ = this_local;
    if (this_local < EnqueuedValue) {
      FormatString<char[24],unsigned_long,char[59],unsigned_long,char[63]>
                ((string *)local_58,(Diligent *)"Can not wait for value ",
                 (char (*) [24])&EnqueuedValue,
                 (unsigned_long *)" that is greater than the last enqueued for signal value (",
                 (char (*) [59])((long)&msg.field_2 + 8),
                 (unsigned_long *)"). This is not supported when NativeFence feature is disabled.",
                 (char (*) [63])local_58);
      Message = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (Message,"DvpDeviceWait",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/FenceBase.hpp"
                 ,99);
      std::__cxx11::string::~string((string *)local_58);
    }
  }
  return;
}

Assistant:

void DvpDeviceWait(Uint64 Value)
    {
#ifdef DILIGENT_DEVELOPMENT
        if (!this->GetDevice()->GetFeatures().NativeFence)
        {
            auto EnqueuedValue = m_EnqueuedFenceValue.load();
            DEV_CHECK_ERR(Value <= EnqueuedValue,
                          "Can not wait for value ", Value, " that is greater than the last enqueued for signal value (", EnqueuedValue,
                          "). This is not supported when NativeFence feature is disabled.");
        }
#endif
    }